

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteLoop<bool,short,duckdb::GenericUnaryWrapper,duckdb::VectorDecimalCastOperator<duckdb::TryCastToDecimal>>
               (bool *ldata,short *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  short sVar1;
  idx_t iVar2;
  idx_t i;
  idx_t iVar3;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    for (iVar3 = 0; count != iVar3; iVar3 = iVar3 + 1) {
      iVar2 = iVar3;
      if (sel_vector->sel_vector != (sel_t *)0x0) {
        iVar2 = (idx_t)sel_vector->sel_vector[iVar3];
      }
      sVar1 = VectorDecimalCastOperator<duckdb::TryCastToDecimal>::Operation<bool,short>
                        (ldata[iVar2],result_mask,iVar3,dataptr);
      result_data[iVar3] = sVar1;
    }
  }
  else {
    for (iVar3 = 0; count != iVar3; iVar3 = iVar3 + 1) {
      iVar2 = iVar3;
      if (sel_vector->sel_vector != (sel_t *)0x0) {
        iVar2 = (idx_t)sel_vector->sel_vector[iVar3];
      }
      if (((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[iVar2 >> 6] >>
           (iVar2 & 0x3f) & 1) == 0) {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_mask->super_TemplatedValidityMask<unsigned_long>,iVar3);
      }
      else {
        sVar1 = VectorDecimalCastOperator<duckdb::TryCastToDecimal>::Operation<bool,short>
                          (ldata[iVar2],result_mask,iVar3,dataptr);
        result_data[iVar3] = sVar1;
      }
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}